

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_sse_blend_popcnt_unroll16(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  
  uVar2 = (ulong)(len >> 3);
  if (len < 0x80) {
    uVar5 = 0;
  }
  else {
    auVar23 = vmovdqa64_avx512vl(_DAT_00116060);
    auVar24 = vmovdqa64_avx512vl(_DAT_00116070);
    uVar4 = 0;
    uVar3 = 0x10;
    do {
      uVar5 = uVar3;
      auVar7 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x50));
      auVar8 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x60));
      auVar9 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x70));
      auVar21 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8),auVar23,
                                  *(undefined1 (*) [16])(array + uVar4 * 8 + 8));
      auVar22 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 8),auVar24,
                                  *(undefined1 (*) [16])(array + uVar4 * 8));
      auVar13 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x10),auVar23,
                                  *(undefined1 (*) [16])(array + uVar4 * 8 + 0x18));
      auVar14 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x18),auVar24,
                                  *(undefined1 (*) [16])(array + uVar4 * 8 + 0x10));
      auVar15 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x20),auVar23,
                                  *(undefined1 (*) [16])(array + uVar4 * 8 + 0x28));
      auVar16 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x28),auVar24,
                                  *(undefined1 (*) [16])(array + uVar4 * 8 + 0x20));
      auVar17 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x30),auVar23,
                                  *(undefined1 (*) [16])(array + uVar4 * 8 + 0x38));
      auVar18 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x38),auVar24,
                                  *(undefined1 (*) [16])(array + uVar4 * 8 + 0x30));
      auVar19 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x40),auVar23,
                                  *(undefined1 (*) [16])(array + uVar4 * 8 + 0x48));
      auVar20 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x48),auVar24,
                                  *(undefined1 (*) [16])(array + uVar4 * 8 + 0x40));
      auVar10 = vmovdqa64_avx512vl(auVar7);
      auVar10 = vpermt2b_avx512vl(auVar10,auVar23,*(undefined1 (*) [16])(array + uVar4 * 8 + 0x58));
      auVar7 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x58),auVar24,auVar7);
      auVar11 = vmovdqa64_avx512vl(auVar8);
      auVar11 = vpermt2b_avx512vl(auVar11,auVar23,*(undefined1 (*) [16])(array + uVar4 * 8 + 0x68));
      auVar8 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x68),auVar24,auVar8);
      auVar12 = vmovdqa64_avx512vl(auVar9);
      auVar12 = vpermt2b_avx512vl(auVar12,auVar23,*(undefined1 (*) [16])(array + uVar4 * 8 + 0x78));
      auVar9 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar4 * 8 + 0x78),auVar24,auVar9);
      lVar6 = 0x20;
      do {
        *(int *)((long)flags + lVar6 + -4) =
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar12[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar10[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar19[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar17[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar15[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar13[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar21[0xf] >> 7) << 0xf)) +
             *(int *)((long)flags + lVar6 + -4);
        *(int *)((long)flags + lVar6 + 0x1c) =
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar8[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar7[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar20[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar14[0xf] >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar22[0xf] >> 7) << 0xf)) +
             *(int *)((long)flags + lVar6 + 0x1c);
        auVar21 = vpaddb_avx(auVar21,auVar21);
        auVar22 = vpaddb_avx(auVar22,auVar22);
        auVar13 = vpaddb_avx(auVar13,auVar13);
        auVar14 = vpaddb_avx(auVar14,auVar14);
        auVar15 = vpaddb_avx(auVar15,auVar15);
        auVar16 = vpaddb_avx(auVar16,auVar16);
        auVar17 = vpaddb_avx(auVar17,auVar17);
        auVar18 = vpaddb_avx(auVar18,auVar18);
        auVar19 = vpaddb_avx(auVar19,auVar19);
        auVar20 = vpaddb_avx(auVar20,auVar20);
        auVar10 = vpaddb_avx(auVar10,auVar10);
        auVar7 = vpaddb_avx(auVar7,auVar7);
        auVar11 = vpaddb_avx(auVar11,auVar11);
        auVar8 = vpaddb_avx(auVar8,auVar8);
        auVar12 = vpaddb_avx(auVar12,auVar12);
        auVar9 = vpaddb_avx(auVar9,auVar9);
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
      uVar4 = uVar5;
      uVar3 = uVar5 + 0x10;
    } while (uVar5 + 0x10 <= uVar2);
  }
  auVar22 = _DAT_00116070;
  auVar21 = _DAT_00116060;
  uVar4 = uVar5 | 8;
  auVar23 = _DAT_00116060;
  auVar24 = _DAT_00116070;
  while (uVar3 = uVar4, auVar13 = auVar23, auVar14 = auVar24, uVar3 <= uVar2) {
    auVar13 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8),auVar21,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 8));
    auVar14 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 8),auVar22,
                                *(undefined1 (*) [16])(array + uVar5 * 8));
    auVar15 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 0x10),auVar21,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 0x18));
    auVar16 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 0x18),auVar22,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 0x10));
    auVar17 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 0x20),auVar21,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 0x28));
    auVar18 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 0x28),auVar22,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 0x20));
    auVar19 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 0x30),auVar21,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 0x38));
    auVar20 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 0x38),auVar22,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 0x30));
    lVar6 = 0x20;
    _DAT_00116060 = auVar23;
    _DAT_00116070 = auVar24;
    do {
      *(int *)((long)flags + lVar6 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar19[0xf] >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar17[0xf] >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar15[0xf] >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar13[0xf] >> 7) << 0xf)) +
           *(int *)((long)flags + lVar6 + -4);
      *(int *)((long)flags + lVar6 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar20[0xf] >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar18[0xf] >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar16[0xf] >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf)) +
           *(int *)((long)flags + lVar6 + 0x1c);
      auVar13 = vpaddb_avx(auVar13,auVar13);
      auVar14 = vpaddb_avx(auVar14,auVar14);
      auVar15 = vpaddb_avx(auVar15,auVar15);
      auVar16 = vpaddb_avx(auVar16,auVar16);
      auVar17 = vpaddb_avx(auVar17,auVar17);
      auVar18 = vpaddb_avx(auVar18,auVar18);
      auVar19 = vpaddb_avx(auVar19,auVar19);
      auVar20 = vpaddb_avx(auVar20,auVar20);
      lVar6 = lVar6 + -4;
    } while (lVar6 != 0);
    uVar5 = uVar3;
    auVar23 = _DAT_00116060;
    auVar24 = _DAT_00116070;
    uVar4 = uVar3 + 8;
  }
  while (uVar4 = uVar5 + 4, _DAT_00116060 = auVar13, _DAT_00116070 = auVar14, uVar4 <= uVar2) {
    auVar21 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8),auVar23,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 8));
    auVar22 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 8),auVar24,
                                *(undefined1 (*) [16])(array + uVar5 * 8));
    auVar15 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 0x10),auVar23,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 0x18));
    auVar16 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 0x18),auVar24,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 0x10));
    lVar6 = 0x20;
    do {
      *(int *)((long)flags + lVar6 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar15[0xf] >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf)) +
           *(int *)((long)flags + lVar6 + -4);
      *(int *)((long)flags + lVar6 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar16[0xf] >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar22[0xf] >> 7) << 0xf)) +
           *(int *)((long)flags + lVar6 + 0x1c);
      auVar21 = vpaddb_avx(auVar21,auVar21);
      auVar22 = vpaddb_avx(auVar22,auVar22);
      auVar15 = vpaddb_avx(auVar15,auVar15);
      auVar16 = vpaddb_avx(auVar16,auVar16);
      lVar6 = lVar6 + -4;
      auVar13 = _DAT_00116060;
      auVar14 = _DAT_00116070;
      uVar5 = uVar4;
    } while (lVar6 != 0);
  }
  while (uVar4 = uVar5 + 2, uVar4 <= uVar2) {
    auVar23 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8),auVar13,
                                *(undefined1 (*) [16])(array + uVar5 * 8 + 8));
    auVar24 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar5 * 8 + 8),auVar14,
                                *(undefined1 (*) [16])(array + uVar5 * 8));
    lVar6 = 0x20;
    do {
      piVar1 = (int *)((long)flags + lVar6 + -4);
      *piVar1 = *piVar1 + POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                                  (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                                                 (ushort)(byte)(auVar23[0xf] >> 7) << 0xf));
      piVar1 = (int *)((long)flags + lVar6 + 0x1c);
      *piVar1 = *piVar1 + POPCOUNT((uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                                  (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                                                 (ushort)(byte)(auVar24[0xf] >> 7) << 0xf));
      auVar23 = vpaddb_avx(auVar23,auVar23);
      auVar24 = vpaddb_avx(auVar24,auVar24);
      lVar6 = lVar6 + -4;
      uVar5 = uVar4;
    } while (lVar6 != 0);
  }
  uVar5 = uVar5 << 3;
  if (uVar5 < len) {
    auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar26 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar28 = vpbroadcastd_avx512f();
      auVar28 = vpsrlvd_avx512f(auVar28,auVar26);
      auVar28 = vpandd_avx512f(auVar28,auVar27);
      auVar25 = vpaddd_avx512f(auVar28,auVar25);
      uVar5 = uVar5 + 1;
    } while (len != uVar5);
    auVar25 = vmovdqu64_avx512f(auVar25);
    *(undefined1 (*) [64])flags = auVar25;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll16(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 16 <= n_cycles; i += 16) {
#define L(p) __m128i v##p = _mm_loadu_si128(data_vectors+i+p);
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U( 2, 3) U( 4, 5) U( 6, 7)
        U(8,9) U(10,11) U(12,13) U(14,15)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A( 2,  3) A( 4, 5) A( 6,  7)
            A(8,9) A(10, 11) A(12,13) A(14, 15)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P( 2,  3) P( 4, 5) P( 6,  7)
            P(8,9) P(10, 11) P(12,13) P(14, 15)
        }
    }

    for (/**/; i + 8 <= n_cycles; i += 8) {
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7)

        U(0,1) U(2,3) U(4,5) U(6,7)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3) A(4,5) A(6, 7)
            P(0,1) P(2, 3) P(4,5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}